

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer.c
# Opt level: O1

void buffer_mremap(mmt_mremap *mm)

{
  cpu_mapping *pcVar1;
  ulong uVar2;
  uint8_t *puVar3;
  size_t __n;
  
  pcVar1 = cpu_mappings[mm->id];
  if (mm->len != pcVar1->length) {
    puVar3 = (uint8_t *)realloc(pcVar1->data,mm->len);
    pcVar1->data = puVar3;
    uVar2 = pcVar1->length;
    __n = mm->len - uVar2;
    if (uVar2 <= mm->len && __n != 0) {
      memset(puVar3 + uVar2,0,__n);
    }
  }
  pcVar1->mmap_offset = mm->offset;
  pcVar1->cpu_addr = mm->start;
  pcVar1->length = mm->len;
  return;
}

Assistant:

void buffer_mremap(struct mmt_mremap *mm)
{
	struct cpu_mapping *mapping = get_cpu_mapping(mm->id);
	if (mm->len != mapping->length)
	{
		mapping->data = realloc(mapping->data, mm->len);
		if (mm->len > mapping->length)
			memset(mapping->data + mapping->length, 0, mm->len - mapping->length);
	}

	mapping->mmap_offset = mm->offset;
	mapping->cpu_addr = mm->start;
	mapping->length = mm->len;
}